

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyUtil.c
# Opt level: O0

int Ivy_ManLevels(Ivy_Man_t *p)

{
  int iVar1;
  Ivy_Obj_t *pIVar2;
  Ivy_Obj_t *pIVar3;
  uint local_30;
  uint local_20;
  int local_1c;
  int LevelMax;
  int i;
  Ivy_Obj_t *pObj;
  Ivy_Man_t *p_local;
  
  local_20 = 0;
  for (local_1c = 0; iVar1 = Vec_PtrSize(p->vPos), local_1c < iVar1; local_1c = local_1c + 1) {
    pIVar2 = (Ivy_Obj_t *)Vec_PtrEntry(p->vPos,local_1c);
    pIVar3 = Ivy_ObjFanin0(pIVar2);
    if (*(uint *)&pIVar3->field_0x8 >> 0xb < local_20) {
      local_30 = local_20;
    }
    else {
      pIVar2 = Ivy_ObjFanin0(pIVar2);
      local_30 = *(uint *)&pIVar2->field_0x8 >> 0xb;
    }
    local_20 = local_30;
  }
  return local_20;
}

Assistant:

int Ivy_ManLevels( Ivy_Man_t * p )
{
    Ivy_Obj_t * pObj;
    int i, LevelMax = 0;
    Ivy_ManForEachPo( p, pObj, i )
        LevelMax = IVY_MAX( LevelMax, (int)Ivy_ObjFanin0(pObj)->Level );
    return LevelMax;
}